

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O0

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
          (LLVMControlDependenceAnalysis *this,BasicBlock *v)

{
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  __first;
  bool bVar1;
  pointer pLVar2;
  LLVMControlDependenceAnalysisOptions *pLVar3;
  iterator this_00;
  const_iterator in_RDX;
  LLVMControlDependenceAnalysis *in_RSI;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *in_RDI;
  ValVec interproc;
  ValVec *ret;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *this_01;
  undefined1 local_38 [8];
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  
  uVar4 = 0;
  this_01 = in_RDI;
  pLVar2 = std::
           unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
           ::operator->((unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                         *)0x12a027);
  (**(code **)(*(long *)pLVar2 + 0x38))(this_01,pLVar2,in_RDX._M_current);
  pLVar3 = getOptions(in_RSI);
  bVar1 = ControlDependenceAnalysisOptions::interproceduralCD
                    (&pLVar3->super_ControlDependenceAnalysisOptions);
  if (bVar1) {
    pLVar2 = std::
             unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
             ::operator->((unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                           *)0x12a067);
    (**(code **)(*(long *)pLVar2 + 0x38))(local_38,pLVar2,in_RDX._M_current);
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(in_RDI);
    __gnu_cxx::
    __normal_iterator<llvm::Value*const*,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>::
    __normal_iterator<llvm::Value**>
              ((__normal_iterator<llvm::Value_*const_*,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                *)this_01,
               (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                *)in_RDI);
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin(in_RDI);
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(in_RDI);
    __first._M_current._7_1_ = uVar4;
    __first._M_current._0_7_ = in_stack_ffffffffffffffe0;
    this_00 = std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
              insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>,void>
                        (in_stack_ffffffffffffffd0,in_RDX,__first,in_stack_ffffffffffffffd8);
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
              ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)this_00._M_current);
  }
  return in_RDI;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }